

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSwitch.c
# Opt level: O3

void Saig_ManSimulateFrames(Saig_SimObj_t *pAig,int nFrames,int nPref)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  
  if (nFrames < 1) {
    return;
  }
  iVar2 = 0;
  puVar3 = pAig->pData;
LAB_006410df:
  do {
    switch((char)puVar3[-1]) {
    case '\0':
      goto switchD_006410f6_caseD_0;
    case '\x01':
      uVar1 = 0xffffffff;
      break;
    case '\x02':
      uVar1 = ((Saig_SimObj_t *)(puVar3 + -3))->iFan0;
      if (uVar1 == 0) {
        uVar1 = Aig_ManRandom(0);
        break;
      }
      if (iVar2 != 0) goto LAB_00641148;
      goto switchD_006410f6_caseD_0;
    case '\x03':
      uVar1 = ((Saig_SimObj_t *)(puVar3 + -3))->iFan0;
LAB_00641148:
      uVar1 = -(uVar1 & 1) ^ pAig[(int)uVar1 >> 1].pData[0];
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigSwitch.c"
                    ,0xc2,"void Saig_ManSimulateFrames(Saig_SimObj_t *, int, int)");
    case '\x05':
      uVar1 = (-(puVar3[-2] & 1) ^ pAig[(int)puVar3[-2] >> 1].pData[0]) &
              (-(((Saig_SimObj_t *)(puVar3 + -3))->iFan0 & 1U) ^
              pAig[((Saig_SimObj_t *)(puVar3 + -3))->iFan0 >> 1].pData[0]);
      break;
    case '\a':
      goto switchD_006410f6_caseD_7;
    }
    *puVar3 = uVar1;
switchD_006410f6_caseD_0:
    if (nPref <= iVar2) {
      uVar1 = (*puVar3 >> 1 & 0x55555555) + (*puVar3 & 0x55555555);
      uVar1 = (uVar1 >> 2 & 0x33333333) + (uVar1 & 0x33333333);
      uVar1 = (uVar1 >> 4 & 0x7070707) + (uVar1 & 0x7070707);
      uVar1 = (uVar1 >> 8 & 0xf000f) + (uVar1 & 0xf000f);
      puVar3[-1] = puVar3[-1] + ((uVar1 >> 0x10) + (uVar1 & 0xffff)) * 0x100;
    }
    puVar3 = puVar3 + 4;
  } while( true );
switchD_006410f6_caseD_7:
  iVar2 = iVar2 + 1;
  puVar3 = pAig->pData;
  if (iVar2 == nFrames) {
    return;
  }
  goto LAB_006410df;
}

Assistant:

void Saig_ManSimulateFrames( Saig_SimObj_t * pAig, int nFrames, int nPref )
{
    Saig_SimObj_t * pEntry;
    int f;
    for ( f = 0; f < nFrames; f++ )
    {
        for ( pEntry = pAig; pEntry->Type != AIG_OBJ_VOID; pEntry++ )
        {
            if ( pEntry->Type == AIG_OBJ_AND )
                Saig_ManSimulateNode( pAig, pEntry );
            else if ( pEntry->Type == AIG_OBJ_CO )
                Saig_ManSimulateOneInput( pAig, pEntry );
            else if ( pEntry->Type == AIG_OBJ_CI )
            {
                if ( pEntry->iFan0 == 0 ) // true PI
                    pEntry->pData[0] = Aig_ManRandom( 0 );
                else if ( f > 0 ) // register output
                    Saig_ManSimulateOneInput( pAig, pEntry );
            }
            else if ( pEntry->Type == AIG_OBJ_CONST1 )
                pEntry->pData[0] = ~0;
            else if ( pEntry->Type != AIG_OBJ_NONE )
                assert( 0 );
            if ( f >= nPref )
                pEntry->Number += Aig_WordCountOnes( pEntry->pData[0] );
        }
    }
}